

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void amrex::Copy<amrex::IArrayBox,void>
               (FabArray<amrex::IArrayBox> *dst,FabArray<amrex::IArrayBox> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  FabArray<amrex::IArrayBox> *in_RDI;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<int> dstFab;
  Array4<const_int> srcFab;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffd90;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  undefined8 in_stack_fffffffffffffdb0;
  undefined1 do_tiling_;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  MFIter *in_stack_fffffffffffffdd0;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  Box local_18c;
  Box *local_170;
  MFIter local_168;
  int local_fc;
  int local_f8;
  int local_f4;
  MFIter *local_e0;
  int local_d8;
  Box *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  undefined8 local_b8;
  int local_b0;
  Box *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  undefined4 local_74;
  IntVect *local_70;
  undefined4 local_64;
  IntVect *local_60;
  undefined4 local_54;
  IntVect *local_50;
  undefined4 local_44;
  Box *local_40;
  undefined4 local_34;
  Box *local_30;
  undefined4 local_24;
  Box *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
  local_fc = in_R8D;
  local_f8 = in_ECX;
  local_f4 = in_EDX;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_168), bVar1) {
    MFIter::growntilebox
              (in_stack_fffffffffffffdd0,
               (IntVect *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_170 = &local_18c;
    bVar1 = Box::ok(local_170);
    if (bVar1) {
      in_stack_fffffffffffffd90 = &local_168;
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(in_RDI,in_stack_fffffffffffffd90);
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(in_RDI,in_stack_fffffffffffffd90);
      local_d0 = local_170;
      local_20 = local_170;
      local_24 = 0;
      local_c4 = (local_170->smallend).vect[0];
      local_30 = local_170;
      local_34 = 1;
      iStack_c0 = (local_170->smallend).vect[1];
      in_stack_fffffffffffffdd0 = *(MFIter **)(local_170->smallend).vect;
      local_40 = local_170;
      local_44 = 2;
      local_d8 = (local_170->smallend).vect[2];
      local_a8 = local_170;
      local_50 = &local_170->bigend;
      local_54 = 0;
      local_9c = local_50->vect[0];
      local_60 = &local_170->bigend;
      local_64 = 1;
      in_stack_fffffffffffffdc8 = (local_170->bigend).vect[1];
      local_b8 = *(undefined8 *)local_50->vect;
      local_70 = &local_170->bigend;
      local_74 = 2;
      in_stack_fffffffffffffdcc = (local_170->bigend).vect[2];
      for (local_254 = 0; local_258 = local_d8, local_e0 = in_stack_fffffffffffffdd0,
          local_bc = local_d8, local_b0 = in_stack_fffffffffffffdcc,
          iStack_98 = in_stack_fffffffffffffdc8, local_94 = in_stack_fffffffffffffdcc,
          local_254 < local_fc; local_254 = local_254 + 1) {
        for (; local_25c = iStack_c0, local_258 <= in_stack_fffffffffffffdcc;
            local_258 = local_258 + 1) {
          for (; local_260 = local_c4, local_25c <= in_stack_fffffffffffffdc8;
              local_25c = local_25c + 1) {
            for (; local_260 <= local_9c; local_260 = local_260 + 1) {
              local_84 = local_260;
              local_88 = local_25c;
              local_8c = local_258;
              local_90 = local_f4 + local_254;
              local_80 = &local_1d0;
              local_c = local_260;
              local_10 = local_25c;
              local_14 = local_258;
              local_18 = local_f8 + local_254;
              local_8 = &local_210;
              *(undefined4 *)
               (local_210 +
               ((long)(local_260 - local_1f0) + (local_25c - local_1ec) * local_208 +
                (local_258 - local_1e8) * local_200 + local_18 * local_1f8) * 4) =
                   *(undefined4 *)
                    (local_1d0 +
                    ((long)(local_260 - local_1b0) + (local_25c - local_1ac) * local_1c8 +
                     (local_258 - local_1a8) * local_1c0 + local_90 * local_1b8) * 4);
            }
          }
        }
      }
    }
    MFIter::operator++(&local_168);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd90);
  return;
}

Assistant:

void
Copy (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& srcarr = src.const_arrays();
        auto const& dstarr = dst.arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstarr[box_no](i,j,k,dstcomp+n) = srcarr[box_no](i,j,k,srccomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,dstcomp+n) = srcFab(i,j,k,srccomp+n);
                });
            }
        }
    }
}